

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void * fio_defer_cycle(void *ignr)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  timespec local_28;
  
  fio_defer_perform();
  do {
    if ((fio_data == (fio_data_s *)0x0) || (fio_data->active == '\0')) {
      return ignr;
    }
    local_28.tv_sec = *(ulong *)(in_FS_OFFSET + -0x300) / 1000000000;
    local_28.tv_nsec = *(ulong *)(in_FS_OFFSET + -0x300) % 1000000000;
    nanosleep(&local_28,(timespec *)0x0);
    iVar1 = fio_defer_has_queue();
    lVar2 = 1;
    if (iVar1 == 0) {
      if (*(ulong *)(in_FS_OFFSET + -0x300) < 0x7ffff00) {
        lVar2 = *(ulong *)(in_FS_OFFSET + -0x300) * 2;
        goto LAB_0013c030;
      }
    }
    else {
LAB_0013c030:
      *(long *)(in_FS_OFFSET + -0x300) = lVar2;
    }
    fio_defer_perform();
  } while( true );
}

Assistant:

static void *fio_defer_cycle(void *ignr) {
  fio_defer_on_thread_start();
  for (;;) {
    fio_defer_perform();
    if (!fio_is_running())
      break;
    fio_defer_thread_wait();
  }
  fio_defer_on_thread_end();
  return ignr;
}